

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

Vec_Int_t * Abc_BufSortByDelay(Buf_Man_t *p,int iPivot)

{
  int Entry;
  Abc_Obj_t *pObj;
  int *__ptr;
  long lVar1;
  
  p->vDelays->nSize = 0;
  pObj = Abc_NtkObj(p->pNtk,iPivot);
  lVar1 = 0;
  while( true ) {
    if ((pObj->vFanouts).nSize <= lVar1) {
      __ptr = Abc_QuickSortCost(p->vDelays->pArray,p->vDelays->nSize,0);
      p->vOrder->nSize = 0;
      for (lVar1 = 0; lVar1 < p->vDelays->nSize; lVar1 = lVar1 + 1) {
        Vec_IntPush(p->vOrder,
                    *(int *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[__ptr[lVar1]]]
                            + 0x10));
      }
      free(__ptr);
      return p->vOrder;
    }
    Entry = Abc_BufEdgeSlack(p,pObj,(Abc_Obj_t *)
                                    pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar1]]);
    if (Entry < 0) break;
    Vec_IntPush(p->vDelays,Entry);
    lVar1 = lVar1 + 1;
  }
  __assert_fail("Slack >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                ,0x2ff,"Vec_Int_t *Abc_BufSortByDelay(Buf_Man_t *, int)");
}

Assistant:

Vec_Int_t * Abc_BufSortByDelay( Buf_Man_t * p, int iPivot )
{
    Abc_Obj_t * pObj, * pFanout;
    int i, Slack, * pOrder;
    Vec_IntClear( p->vDelays );
    pObj = Abc_NtkObj( p->pNtk, iPivot );
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        Slack = Abc_BufEdgeSlack(p, pObj, pFanout);
        assert( Slack >= 0 );
        Vec_IntPush( p->vDelays, Abc_MaxInt(0, Slack) );
    }
    pOrder = Abc_QuickSortCost( Vec_IntArray(p->vDelays), Vec_IntSize(p->vDelays), 0 );
    Vec_IntClear( p->vOrder );
    for ( i = 0; i < Vec_IntSize(p->vDelays); i++ )
        Vec_IntPush( p->vOrder, Abc_ObjId(Abc_ObjFanout(pObj, pOrder[i])) );
    ABC_FREE( pOrder );
//    for ( i = 0; i < Vec_IntSize(p->vDelays); i++ )
//        printf( "%5d - %5d   ", Vec_IntEntry(p->vOrder, i), Abc_BufEdgeSlack(p, pObj, Abc_NtkObj(p->pNtk, Vec_IntEntry(p->vOrder, i))) );
    return p->vOrder;        
}